

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dense.cpp
# Opt level: O0

void __thiscall Dense::~Dense(Dense *this)

{
  ostream *this_00;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR_forward_00198870;
  this_00 = std::operator<<((ostream *)&std::cout,"Object deconstructed!");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)(in_RDI + 0xe));
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x155c93);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x155ca0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x155cad);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x155cba);
  return;
}

Assistant:

Dense::~Dense() {
    cout << "Object deconstructed!" << endl;
}